

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

int ngram_model_set_apply_weights(ngram_model_t *base,float32 lw,float32 wip)

{
  int32 i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < base[1].refcount; lVar1 = lVar1 + 1) {
    ngram_model_apply_weights(*(ngram_model_t **)(base[1].n_counts + lVar1 * 2),lw,wip);
  }
  return 0;
}

Assistant:

static int
ngram_model_set_apply_weights(ngram_model_t * base, float32 lw,
                              float32 wip)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    /* Apply weights to each sub-model. */
    for (i = 0; i < set->n_models; ++i)
        ngram_model_apply_weights(set->lms[i], lw, wip);
    return 0;
}